

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O1

BOOL __thiscall
Js::TypedArray<double,_false,_false>::DirectSetItemAtRange
          (TypedArray<double,_false,_false> *this,TypedArray<double,_false,_false> *fromArray,
          int32 iSrcStart,int32 iDstStart,uint32 length,_func_double_Var_ScriptContext_ptr *convFunc
          )

{
  uint uVar1;
  Type puVar2;
  Type puVar3;
  JavascriptLibrary *pJVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  
  puVar2 = (this->super_TypedArrayBase).buffer;
  puVar3 = (fromArray->super_TypedArrayBase).buffer;
  if (puVar3 == (Type)0x0 || puVar2 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x156,"(srcBuffer && dstBuffer)","srcBuffer && dstBuffer");
    if (!bVar6) goto LAB_00ad4fb3;
    *puVar7 = 0;
  }
  if (0xfffffff < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x157,
                                "(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName))",
                                "length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName)");
    if (!bVar6) goto LAB_00ad4fb3;
    *puVar7 = 0;
  }
  if (iSrcStart != iDstStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x159,"(iSrcStart == iDstStart)","iSrcStart == iDstStart");
    if (!bVar6) goto LAB_00ad4fb3;
    *puVar7 = 0;
  }
  if ((((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached != false)
     || (((fromArray->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached ==
         true)) {
    JavascriptError::ThrowTypeError
              ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  if (iDstStart < 0) {
    if ((long)((long)iDstStart + (ulong)length) < 0) {
      return 1;
    }
    length = length + iDstStart;
    iDstStart = 0;
  }
  if (CARRY4(length,iDstStart)) {
    ::Math::DefaultOverflowPolicy();
  }
  uVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
  uVar9 = uVar1 - iDstStart;
  if (uVar1 < (uint)iDstStart) {
    uVar9 = 0;
  }
  if (length + iDstStart < uVar1) {
    uVar9 = length;
  }
  uVar1 = (fromArray->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
  uVar10 = uVar1 - iDstStart;
  if (uVar1 < (uint)iDstStart) {
    uVar10 = 0;
  }
  if (length + iDstStart < uVar1) {
    uVar10 = length;
  }
  if (length < uVar10) {
    uVar10 = length;
  }
  uVar1 = uVar9;
  if (uVar10 < uVar9) {
    uVar1 = uVar10;
  }
  uVar8 = (ulong)uVar1;
  if (uVar8 * 8 < uVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x175,"(byteSize >= length)","byteSize >= length");
    if (!bVar6) {
LAB_00ad4fb3:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar7 = 0;
  }
  js_memcpy_s(puVar2 + (ulong)(uint)iDstStart * 8,(ulong)uVar9 * 8,
              puVar3 + (ulong)(uint)iDstStart * 8,uVar8 * 8);
  if (uVar10 < uVar9) {
    pJVar4 = (((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
               super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
    dVar11 = (*convFunc)((pJVar4->super_JavascriptLibraryBase).undefinedValue.ptr,
                         (pJVar4->super_JavascriptLibraryBase).scriptContext.ptr);
    do {
      *(double *)(puVar2 + uVar8 * 8) = dVar11;
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  return 1;
}

Assistant:

inline BOOL DirectSetItemAtRange(TypedArray *fromArray, __in int32 iSrcStart, __in int32 iDstStart, __in uint32 length, TypeName(*convFunc)(Var value, ScriptContext* scriptContext))
        {
            TypeName* dstBuffer = (TypeName*)buffer;
            TypeName* srcBuffer = (TypeName*)fromArray->buffer;
            Assert(srcBuffer && dstBuffer);
            Assert(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName));
            // caller checks that src and dst index are the same
            Assert(iSrcStart == iDstStart);

            if (this->IsDetachedBuffer() || fromArray->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            // Fixup destination start in case it's negative
            uint32 start = iDstStart;
            if (iDstStart < 0)
            {
                if ((int64)(length) + iDstStart < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }

                length += iDstStart;
                start = 0;
            }

            uint32 dstLength = UInt32Math::Add(start, length) < GetLength() ? length : GetLength() > start ? GetLength() - start : 0;
            uint32 srcLength = start + length < fromArray->GetLength() ? length : (fromArray->GetLength() > start ? fromArray->GetLength() - start : 0);

            // length is the minimum of length, srcLength and dstLength
            length = length < srcLength ? (length < dstLength ? length : dstLength) : (srcLength < dstLength ? srcLength : dstLength);

            const size_t byteSize = sizeof(TypeName) * length;
            Assert(byteSize >= length); // check for overflow
            js_memcpy_s(dstBuffer + start, dstLength * sizeof(TypeName), srcBuffer + start, byteSize);

            if (dstLength > length)
            {
                TypeName undefinedValue = convFunc(GetLibrary()->GetUndefined(), GetScriptContext());
                for (uint32 i = length; i < dstLength; i++)
                {
                    dstBuffer[i] = undefinedValue;
                }
            }

            return true;
        }